

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simd_alignment_engine_implementation.hpp
# Opt level: O1

Alignment * __thiscall
spoa::SimdAlignmentEngine<(spoa::Architecture)3>::
Linear<spoa::InstructionSet<(spoa::Architecture)3,short>>
          (Alignment *__return_storage_ptr__,SimdAlignmentEngine<(spoa::Architecture)3> *this,
          uint32_t sequence_len,Graph *graph,int32_t *score)

{
  type_conflict *ptVar1;
  uint *puVar2;
  undefined2 uVar3;
  undefined1 auVar4 [32];
  short sVar5;
  AlignmentType AVar6;
  pointer ppNVar7;
  Implementation *pIVar8;
  Node *pNVar9;
  __mxxxi *palVar10;
  __mxxxi *palVar11;
  pointer ppEVar12;
  __mxxxi alVar13;
  __mxxxi alVar14;
  undefined1 auVar15 [32];
  longlong lVar16;
  longlong lVar17;
  longlong lVar18;
  short value;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  pointer ppVar22;
  uint uVar23;
  pointer ppNVar24;
  pointer ppEVar25;
  pointer ppVar26;
  ulong uVar27;
  int iVar28;
  long lVar29;
  __mxxxi *palVar30;
  int iVar31;
  long lVar32;
  ulong uVar33;
  short sVar34;
  long lVar35;
  pointer ppEVar36;
  ulong uVar37;
  uint uVar38;
  ulong uVar39;
  __mxxxi *palVar40;
  iterator __begin5;
  ulong uVar41;
  int32_t *piVar42;
  bool bVar43;
  undefined1 auVar44 [16];
  __mxxxi alVar45;
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar48 [32];
  __mxxxi alVar49;
  undefined1 in_ZMM5 [64];
  int32_t j;
  vector<unsigned_int,_std::allocator<unsigned_int>_> predecessors;
  vector<spoa::InstructionSet<(spoa::Architecture)3,_short>::Storage,_std::allocator<spoa::InstructionSet<(spoa::Architecture)3,_short>::Storage>_>
  backtrack_storage;
  type unpacked [16];
  bool local_149;
  uint local_148;
  uint local_144;
  long local_140;
  type_conflict *local_138;
  pointer local_130;
  uint local_124;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *local_120;
  uint local_114;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_110;
  int32_t *local_f8;
  pointer local_f0;
  ulong local_e8;
  long local_e0;
  uint local_d4;
  Graph *local_d0;
  type_conflict *local_c8;
  __mxxxi local_c0;
  pointer local_90;
  ulong local_88;
  longlong local_80;
  longlong lStack_78;
  longlong lStack_70;
  longlong lStack_68;
  
  auVar44 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,sequence_len);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = auVar44._0_8_ * 0.0625;
  auVar44 = vroundsd_avx(auVar47,auVar47,10);
  local_140 = vcvttsd2usi_avx512f(auVar44);
  local_80 = 0;
  lStack_78 = 0;
  lStack_70 = 0;
  lStack_68 = 0;
  uVar19 = 0;
  uVar23 = 0;
  do {
    *(undefined2 *)((long)&local_80 + uVar19 * 2) = 0x8400;
    if (((uint)uVar19 + 1 & (uint)uVar19 & 0xfffffffe) == 0) {
      uVar41 = (ulong)uVar23;
      uVar23 = uVar23 + 1;
      palVar30 = ((this->pimpl_)._M_t.
                  super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  .
                  super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                 ._M_head_impl)->masks + uVar41;
      (*palVar30)[0] = local_80;
      (*palVar30)[1] = lStack_78;
      (*palVar30)[2] = lStack_70;
      (*palVar30)[3] = lStack_68;
    }
  } while ((uVar19 < 0xf) && (uVar19 = uVar19 + 1, uVar23 < 4));
  palVar30 = ((this->pimpl_)._M_t.
              super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
              ._M_t.
              super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
              .
              super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
             ._M_head_impl)->masks;
  palVar30[4][0] = -0x7bff7bff7c000000;
  palVar30[4][1] = -0x7bff7bff7bff7c00;
  palVar30[4][2] = -0x7bff7bff7bff7c00;
  palVar30[4][3] = -0x7bff7bff7bff7c00;
  alVar45 = (__mxxxi)vpbroadcastw_avx512vl();
  *((this->pimpl_)._M_t.
    super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
    ._M_t.
    super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
    .
    super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
   ._M_head_impl)->penalties = alVar45;
  lVar20 = 0x20;
  do {
    palVar30 = ((this->pimpl_)._M_t.
                super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                ._M_t.
                super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                .
                super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
               ._M_head_impl)->penalties;
    auVar46 = *(undefined1 (*) [32])((long)palVar30[-1] + lVar20);
    auVar46 = vpaddw_avx2(auVar46,auVar46);
    *(undefined1 (*) [32])((long)*palVar30 + lVar20) = auVar46;
    lVar20 = lVar20 + 0x20;
  } while (lVar20 != 0x80);
  value = -0x7c00;
  if ((this->super_AlignmentEngine).type_ == kSW) {
    value = 0;
  }
  uVar23 = sequence_len - 1;
  ppNVar24 = (graph->rank_to_node_).
             super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppNVar7 = (graph->rank_to_node_).
            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_138 = (type_conflict *)CONCAT44(local_138._4_4_,uVar23);
  if (ppNVar24 == ppNVar7) {
    uVar19 = 0xffffffff;
  }
  else {
    local_f0 = (pointer)CONCAT44(local_f0._4_4_,(int)(this->super_AlignmentEngine).g_);
    auVar46 = vpbroadcastw_avx512vl();
    local_130 = (pointer)(ulong)(uVar23 & 0xf);
    uVar19 = 0xffffffff;
    alVar45[1]._0_2_ = 0x8400;
    alVar45[0] = 0x8400840084008400;
    alVar45[1]._2_2_ = 0x8400;
    alVar45[1]._4_2_ = 0x8400;
    alVar45[1]._6_2_ = 0x8400;
    alVar45[2]._0_2_ = 0x8400;
    alVar45[2]._2_2_ = 0x8400;
    alVar45[2]._4_2_ = 0x8400;
    alVar45[2]._6_2_ = 0x8400;
    alVar45[3]._0_2_ = 0x8400;
    alVar45[3]._2_2_ = 0x8400;
    alVar45[3]._4_2_ = 0x8400;
    alVar45[3]._6_2_ = 0x8400;
    do {
      pIVar8 = (this->pimpl_)._M_t.
               super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               ._M_t.
               super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
               .
               super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
               ._M_head_impl;
      pNVar9 = *ppNVar24;
      lVar20 = *(long *)&(pIVar8->node_id_to_rank).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
      ppEVar36 = (pNVar9->inedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (ppEVar36 ==
          (pNVar9->inedges).
          super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        uVar41 = 0;
      }
      else {
        uVar41 = (ulong)(*(int *)(lVar20 + (ulong)(*ppEVar36)->tail->id * 4) + 1);
      }
      lVar29 = (ulong)pNVar9->code * local_140;
      palVar30 = pIVar8->sequence_profile;
      uVar38 = *(int *)(lVar20 + (ulong)pNVar9->id * 4) + 1;
      palVar10 = pIVar8->H;
      palVar40 = palVar10 + (ulong)uVar38 * local_140;
      if (local_140 != 0) {
        lVar32 = uVar41 * local_140;
        uVar3 = *(undefined2 *)
                 (*(long *)&(pIVar8->first_column).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl + uVar41 * 4);
        auVar48 = vpsrldq_avx2(ZEXT1632(CONCAT214(uVar3,CONCAT212(uVar3,CONCAT210(uVar3,CONCAT28(
                                                  uVar3,CONCAT26(uVar3,CONCAT24(uVar3,CONCAT22(uVar3
                                                  ,uVar3)))))))),0xe);
        lVar35 = 0;
        lVar20 = local_140;
        do {
          auVar4 = *(undefined1 (*) [32])((long)palVar10[lVar32] + lVar35);
          auVar15 = vperm2i128_avx2(auVar4,auVar4,0x28);
          auVar4 = vpalignr_avx2(auVar4,auVar15,0xe);
          auVar4 = vpor_avx2(auVar4,auVar48);
          auVar48 = vpsrldq_avx2(ZEXT1632(*(undefined1 (*) [16])
                                           ((long)palVar10[lVar32] + lVar35 + 0x10)),0xe);
          *(undefined1 (*) [32])((long)*palVar40 + lVar35) = auVar4;
          auVar4 = vpaddw_avx2(auVar4,*(undefined1 (*) [32])((long)palVar30[lVar29] + lVar35));
          auVar15 = vpaddw_avx2(auVar46,*(undefined1 (*) [32])((long)palVar10[lVar32] + lVar35));
          auVar4 = vpmaxsw_avx2(auVar4,auVar15);
          in_ZMM5 = ZEXT3264(auVar4);
          *(undefined1 (*) [32])((long)*palVar40 + lVar35) = auVar4;
          lVar35 = lVar35 + 0x20;
          lVar20 = lVar20 + -1;
        } while (lVar20 != 0);
      }
      ppEVar36 = ((*ppNVar24)->inedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (8 < (ulong)((long)((*ppNVar24)->inedges).
                            super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar36)) {
        uVar41 = 1;
        do {
          if (local_140 != 0) {
            pIVar8 = (this->pimpl_)._M_t.
                     super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                     .
                     super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                     ._M_head_impl;
            uVar21 = (ulong)(*(int *)(*(long *)&(pIVar8->node_id_to_rank).
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     + (ulong)ppEVar36[uVar41]->tail->id * 4) + 1);
            uVar3 = *(undefined2 *)
                     (*(long *)&(pIVar8->first_column).super__Vector_base<int,_std::allocator<int>_>
                                ._M_impl + uVar21 * 4);
            lVar32 = uVar21 * local_140;
            palVar10 = pIVar8->H;
            auVar48 = vpsrldq_avx2(ZEXT1632(CONCAT214(uVar3,CONCAT212(uVar3,CONCAT210(uVar3,CONCAT28
                                                  (uVar3,CONCAT26(uVar3,CONCAT24(uVar3,CONCAT22(
                                                  uVar3,uVar3)))))))),0xe);
            lVar35 = 0;
            lVar20 = local_140;
            do {
              auVar4 = *(undefined1 (*) [32])((long)palVar10[lVar32] + lVar35);
              auVar15 = vperm2i128_avx2(auVar4,auVar4,0x28);
              auVar4 = vpalignr_avx2(auVar4,auVar15,0xe);
              auVar4 = vpor_avx2(auVar4,auVar48);
              auVar48 = vpsrldq_avx2(ZEXT1632(*(undefined1 (*) [16])
                                               ((long)palVar10[lVar32] + lVar35 + 0x10)),0xe);
              auVar4 = vpaddw_avx2(auVar4,*(undefined1 (*) [32])((long)palVar30[lVar29] + lVar35));
              auVar15 = vpaddw_avx2(auVar46,*(undefined1 (*) [32])((long)palVar10[lVar32] + lVar35))
              ;
              auVar4 = vpmaxsw_avx2(auVar4,auVar15);
              auVar4 = vpmaxsw_avx2(auVar4,*(undefined1 (*) [32])((long)*palVar40 + lVar35));
              in_ZMM5 = ZEXT3264(auVar4);
              *(undefined1 (*) [32])((long)*palVar40 + lVar35) = auVar4;
              lVar35 = lVar35 + 0x20;
              lVar20 = lVar20 + -1;
            } while (lVar20 != 0);
          }
          uVar41 = (ulong)((int)uVar41 + 1);
          ppEVar36 = ((*ppNVar24)->inedges).
                     super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
        } while (uVar41 < (ulong)((long)((*ppNVar24)->inedges).
                                        super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar36
                                 >> 3));
      }
      alVar49 = alVar45;
      if (local_140 != 0) {
        auVar44 = vpbroadcastw_avx512vl();
        in_ZMM5._0_32_ = vpsrldq_avx2(ZEXT1632(auVar44),0xe);
        palVar30 = palVar40;
        lVar20 = local_140;
        do {
          auVar48 = vorpd_avx(in_ZMM5._0_32_,
                              (undefined1  [32])
                              ((this->pimpl_)._M_t.
                               super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                               .
                               super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                              ._M_head_impl)->masks[4]);
          alVar13 = (__mxxxi)vpmaxsw_avx2(auVar48,(undefined1  [32])*palVar30);
          *palVar30 = alVar13;
          pIVar8 = (this->pimpl_)._M_t.
                   super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                   .
                   super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                   ._M_head_impl;
          palVar10 = pIVar8->masks;
          palVar11 = pIVar8->penalties;
          auVar48 = vpaddw_avx2((undefined1  [32])alVar13,(undefined1  [32])*palVar11);
          auVar4 = vperm2i128_avx2(auVar48,auVar48,0x28);
          auVar48 = vpalignr_avx2(auVar48,auVar4,0xe);
          auVar48 = vpor_avx2(auVar48,(undefined1  [32])*palVar10);
          alVar13 = (__mxxxi)vpmaxsw_avx2((undefined1  [32])alVar13,auVar48);
          *palVar30 = alVar13;
          auVar48 = vpaddw_avx2((undefined1  [32])alVar13,(undefined1  [32])palVar11[1]);
          auVar4 = vperm2i128_avx2(auVar48,auVar48,0x28);
          auVar48 = vpalignr_avx2(auVar48,auVar4,0xc);
          auVar48 = vpor_avx2(auVar48,(undefined1  [32])palVar10[1]);
          alVar13 = (__mxxxi)vpmaxsw_avx2((undefined1  [32])alVar13,auVar48);
          *palVar30 = alVar13;
          auVar48 = vpaddw_avx2((undefined1  [32])alVar13,(undefined1  [32])palVar11[2]);
          auVar48 = valignq_avx512vl(auVar48,SUB6432(ZEXT1664((undefined1  [16])0x0),0),3);
          auVar48 = vpor_avx2(auVar48,(undefined1  [32])palVar10[2]);
          alVar13 = (__mxxxi)vpmaxsw_avx2((undefined1  [32])alVar13,auVar48);
          *palVar30 = alVar13;
          auVar48 = vpaddw_avx2((undefined1  [32])alVar13,(undefined1  [32])palVar11[3]);
          auVar48 = vperm2i128_avx2(auVar48,auVar48,0x28);
          auVar48 = vpor_avx2(auVar48,(undefined1  [32])palVar10[3]);
          alVar13 = (__mxxxi)vpmaxsw_avx2((undefined1  [32])alVar13,auVar48);
          *palVar30 = alVar13;
          if ((this->super_AlignmentEngine).type_ == kSW) {
            alVar14 = (__mxxxi)vpmaxsw_avx2((undefined1  [32])alVar13,
                                            SUB6432(ZEXT1664((undefined1  [16])0x0),0));
            *palVar30 = alVar14;
          }
          auVar44 = vpaddw_avx(alVar13._16_16_,auVar46._16_16_);
          auVar48 = vpsrldq_avx2(ZEXT1632(auVar44),0xe);
          in_ZMM5 = ZEXT3264(auVar48);
          alVar49 = (__mxxxi)vpmaxsw_avx2((undefined1  [32])alVar49,(undefined1  [32])*palVar30);
          palVar30 = palVar30 + 1;
          lVar20 = lVar20 + -1;
        } while (lVar20 != 0);
      }
      AVar6 = (this->super_AlignmentEngine).type_;
      sVar34 = value;
      if (AVar6 == kSW) {
        local_c0[0] = alVar49[0];
        local_c0[1] = alVar49[1];
        local_c0[2] = alVar49[2];
        local_c0[3] = alVar49[3];
        lVar20 = 0;
        sVar34 = 0;
        do {
          sVar5 = *(short *)((long)local_c0 + lVar20 * 2);
          if (sVar34 <= sVar5) {
            sVar34 = sVar5;
          }
          lVar20 = lVar20 + 1;
        } while (lVar20 != 0x10);
LAB_0011c591:
        if (value < sVar34) {
          uVar19 = (ulong)uVar38;
        }
        local_c0 = alVar49;
        if (sVar34 < value) {
          sVar34 = value;
        }
      }
      else if (AVar6 == kNW) {
        if (((*ppNVar24)->outedges).
            super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
            super__Vector_impl_data._M_start ==
            ((*ppNVar24)->outedges).
            super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          local_c0 = palVar40[local_140 + -1];
          sVar5 = *(short *)((long)local_c0 + (long)local_130 * 2);
          if (value < sVar5) {
            uVar19 = (ulong)uVar38;
          }
          if (value <= sVar5) {
            sVar34 = sVar5;
          }
        }
      }
      else if ((AVar6 == kOV) &&
              (((*ppNVar24)->outedges).
               super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl
               .super__Vector_impl_data._M_start ==
               ((*ppNVar24)->outedges).
               super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl
               .super__Vector_impl_data._M_finish)) {
        local_c0[0] = alVar49[0];
        local_c0[1] = alVar49[1];
        local_c0[2] = alVar49[2];
        local_c0[3] = alVar49[3];
        lVar20 = 0;
        sVar34 = 0;
        do {
          sVar5 = *(short *)((long)local_c0 + lVar20 * 2);
          if (sVar34 <= sVar5) {
            sVar34 = sVar5;
          }
          lVar20 = lVar20 + 1;
        } while (lVar20 != 0x10);
        goto LAB_0011c591;
      }
      value = sVar34;
      ppNVar24 = ppNVar24 + 1;
    } while (ppNVar24 != ppNVar7);
  }
  iVar28 = (int)uVar19;
  if (iVar28 == -1) {
    (__return_storage_ptr__->
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    if (score != (int32_t *)0x0) {
      *score = (int)value;
    }
    AVar6 = (this->super_AlignmentEngine).type_;
    local_120 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                __return_storage_ptr__;
    local_f8 = score;
    local_d0 = graph;
    if ((AVar6 == kSW) ||
       (((local_148 = uVar23, AVar6 != kNW && (local_148 = 0xffffffff, AVar6 == kOV)) &&
        (pNVar9 = (graph->rank_to_node_).
                  super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[(long)iVar28 + -1], local_148 = uVar23,
        (pNVar9->outedges).
        super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        *(pointer *)
         ((long)&(pNVar9->outedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl + 8))))) {
      local_148 = _mmxxx_index_of<(spoa::Architecture)3,spoa::InstructionSet<(spoa::Architecture)3,short>>
                            (((this->pimpl_)._M_t.
                              super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                              .
                              super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                             ._M_head_impl)->H + iVar28 * local_140,(uint32_t)local_140,value);
    }
    if (iVar28 == 0) {
      uVar23 = 1;
    }
    else {
      uVar23 = 1;
      uVar41 = 0;
      do {
        pNVar9 = (graph->rank_to_node_).
                 super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar41];
        uVar38 = (uint)((ulong)((long)*(pointer *)
                                       ((long)&(pNVar9->inedges).
                                               super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                                               ._M_impl + 8) -
                               *(long *)&(pNVar9->inedges).
                                         super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                                         ._M_impl.super__Vector_impl_data) >> 3);
        if (uVar38 < uVar23) {
          uVar38 = uVar23;
        }
        uVar23 = uVar38;
        uVar41 = uVar41 + 1;
      } while (uVar19 != uVar41);
    }
    std::
    vector<spoa::InstructionSet<(spoa::Architecture)3,_short>::Storage,_std::allocator<spoa::InstructionSet<(spoa::Architecture)3,_short>::Storage>_>
    ::vector((vector<spoa::InstructionSet<(spoa::Architecture)3,_short>::Storage,_std::allocator<spoa::InstructionSet<(spoa::Architecture)3,_short>::Storage>_>
              *)local_c0,(ulong)(uVar23 * 0x20 + 0x30),(allocator_type *)&local_110);
    local_f0 = (pointer)(local_c0[0] + 0x20);
    local_130 = (pointer)local_c0[0];
    local_c8 = ((pointer)(local_c0[0] + 0x20))->arr + (uVar23 << 4);
    local_138 = local_c8 + (uVar23 << 4);
    local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
    local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (uint *)0x0;
    local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (uint *)0x0;
    local_114 = local_148 >> 4;
    piVar42 = (int32_t *)(ulong)(local_148 & 0xf);
    local_e8 = 0;
    *(pointer *)(local_120 + 0x10) = (pointer)0x0;
    *(undefined1 (*) [16])local_120 = (undefined1  [16])0x0;
    local_149 = true;
    local_124 = 0;
    do {
      iVar28 = (int)uVar19;
      if ((local_148 == 0xffffffff) || (iVar28 == 0)) {
        uVar41 = uVar19 & 0xffffffff;
        break;
      }
      local_e0 = (long)(iVar28 + -1);
      local_f8 = piVar42;
      if (local_149) {
        if (local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        local_90 = (graph->rank_to_node_).
                   super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        uVar41 = (ulong)local_114;
        palVar30 = ((this->pimpl_)._M_t.
                    super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    .
                    super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                   ._M_head_impl)->H + iVar28 * local_140 + uVar41;
        lVar16 = (*palVar30)[1];
        lVar17 = (*palVar30)[2];
        lVar18 = (*palVar30)[3];
        *(longlong *)local_130->arr = (*palVar30)[0];
        *(longlong *)(local_130->arr + 4) = lVar16;
        *(longlong *)(local_130->arr + 8) = lVar17;
        *(longlong *)(local_130->arr + 0xc) = lVar18;
        ppEVar36 = (local_90[local_e0]->inedges).
                   super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppEVar12 = *(pointer *)
                    ((long)&(local_90[local_e0]->inedges).
                            super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                            ._M_impl + 8);
        local_88 = uVar19;
        if (ppEVar36 == ppEVar12) {
          local_144 = 0;
          if (local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<int>
                      (&local_110,
                       (iterator)
                       local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(int *)&local_144);
          }
          else {
            *local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = 0;
            local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          palVar30 = ((this->pimpl_)._M_t.
                      super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      .
                      super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                     ._M_head_impl)->H + uVar41;
          lVar16 = (*palVar30)[1];
          lVar17 = (*palVar30)[2];
          lVar18 = (*palVar30)[3];
          *(longlong *)local_f0->arr = (*palVar30)[0];
          *(longlong *)(local_f0->arr + 4) = lVar16;
          *(longlong *)(local_f0->arr + 8) = lVar17;
          *(longlong *)(local_f0->arr + 0xc) = lVar18;
        }
        else {
          uVar19 = 0;
          do {
            local_144 = *(int *)(*(long *)&(((this->pimpl_)._M_t.
                                             super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                                             .
                                             super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                                            ._M_head_impl)->node_id_to_rank).
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                + (ulong)(*ppEVar36)->tail->id * 4) + 1;
            if (local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        (&local_110,
                         (iterator)
                         local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,&local_144);
            }
            else {
              *local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = local_144;
              local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish + 1;
            }
            palVar30 = ((this->pimpl_)._M_t.
                        super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                        .
                        super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                       ._M_head_impl)->H +
                       (ulong)local_110.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish[-1] * local_140 + uVar41;
            lVar16 = (*palVar30)[1];
            lVar17 = (*palVar30)[2];
            lVar18 = (*palVar30)[3];
            ptVar1 = local_f0->arr + uVar19;
            *(longlong *)ptVar1 = (*palVar30)[0];
            *(longlong *)(ptVar1 + 4) = lVar16;
            *(longlong *)(ptVar1 + 8) = lVar17;
            *(longlong *)(ptVar1 + 0xc) = lVar18;
            ppEVar36 = ppEVar36 + 1;
            uVar19 = (ulong)((int)uVar19 + 0x10);
          } while (ppEVar36 != ppEVar12);
        }
        palVar30 = ((this->pimpl_)._M_t.
                    super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    .
                    super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                   ._M_head_impl)->sequence_profile +
                   (ulong)local_90[local_e0]->code * local_140 + uVar41;
        lVar16 = (*palVar30)[1];
        lVar17 = (*palVar30)[2];
        lVar18 = (*palVar30)[3];
        *(longlong *)(local_138 + 0x10) = (*palVar30)[0];
        *(longlong *)(local_138 + 0x14) = lVar16;
        *(longlong *)(local_138 + 0x18) = lVar17;
        *(longlong *)(local_138 + 0x1c) = lVar18;
        uVar19 = local_88;
        graph = local_d0;
      }
      uVar23 = (uint)local_f8;
      uVar21 = (ulong)local_f8 & 0xffffffff;
      iVar28 = (int)uVar19;
      if (((this->super_AlignmentEngine).type_ == kSW) && (local_130->arr[uVar21] == 0)) {
        bVar43 = false;
        uVar41 = uVar19 & 0xffffffff;
        piVar42 = local_f8;
      }
      else {
        if (uVar23 == 0) {
          pIVar8 = (this->pimpl_)._M_t.
                   super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                   .
                   super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                   ._M_head_impl;
          if (local_114 == 0) {
            lVar20 = *(long *)&(pIVar8->first_column).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl;
            local_138[0xf] = *(type_conflict *)(lVar20 + (long)iVar28 * 4);
            if ((long)local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start != 0) {
              uVar41 = 0xf;
              uVar27 = 0;
              do {
                puVar2 = local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start + uVar27;
                uVar27 = uVar27 + 1;
                local_c8[uVar41] = *(type_conflict *)(lVar20 + (ulong)*puVar2 * 4);
                uVar41 = (ulong)((int)uVar41 + 0x10);
              } while ((uVar27 & 0xffffffff) <
                       (ulong)((long)local_110.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_110.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 2));
            }
          }
          else {
            palVar30 = pIVar8->H + iVar28 * local_140 + ((ulong)local_114 - 1);
            lVar16 = *(longlong *)((long)*palVar30 + 8);
            lVar17 = *(longlong *)((long)*palVar30 + 0x10);
            lVar18 = *(longlong *)((long)*palVar30 + 0x18);
            *(longlong *)local_138 = (*palVar30)[0];
            *(longlong *)(local_138 + 4) = lVar16;
            *(longlong *)(local_138 + 8) = lVar17;
            *(longlong *)(local_138 + 0xc) = lVar18;
            if ((long)local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start != 0) {
              uVar41 = 0;
              uVar27 = 0;
              do {
                palVar30 = ((this->pimpl_)._M_t.
                            super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                            .
                            super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                           ._M_head_impl)->H +
                           (ulong)local_110.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar27] * local_140 +
                           ((ulong)local_114 - 1);
                lVar16 = *(longlong *)((long)*palVar30 + 8);
                lVar17 = *(longlong *)((long)*palVar30 + 0x10);
                lVar18 = *(longlong *)((long)*palVar30 + 0x18);
                ptVar1 = local_c8 + uVar41;
                *(longlong *)ptVar1 = (*palVar30)[0];
                *(longlong *)(ptVar1 + 4) = lVar16;
                *(longlong *)(ptVar1 + 8) = lVar17;
                *(longlong *)(ptVar1 + 0xc) = lVar18;
                uVar27 = uVar27 + 1;
                uVar41 = (ulong)((int)uVar41 + 0x10);
              } while ((uVar27 & 0xffffffff) <
                       (ulong)((long)local_110.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_110.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 2));
            }
          }
        }
        uVar27 = (long)local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 2;
        if (local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar38 = uVar23 - 1;
          uVar37 = 0xf;
          uVar41 = 1;
          uVar39 = 0;
          do {
            uVar33 = uVar41;
            if (uVar23 == 0) {
              if ((int)local_138[0x10] + (int)local_c8[uVar37] == (int)local_130->arr[0]) {
LAB_0011ca4a:
                local_e8 = (ulong)local_110.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar39];
                local_124 = local_148 - 1;
                bVar43 = true;
                goto LAB_0011ca60;
              }
            }
            else if ((int)local_138[uVar21 + 0x10] + (int)local_130[1].arr[uVar38] ==
                     (int)local_130->arr[uVar21]) goto LAB_0011ca4a;
            uVar38 = uVar38 + 0x10;
            uVar37 = (ulong)((int)uVar37 + 0x10);
            uVar41 = (ulong)((int)uVar33 + 1);
            uVar39 = uVar33;
          } while (uVar33 < uVar27);
        }
        bVar43 = false;
LAB_0011ca60:
        uVar41 = local_e8;
        if (local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start && !bVar43) {
          iVar31 = (int)(this->super_AlignmentEngine).g_;
          if (local_130[1].arr[uVar21] + iVar31 == (int)local_130->arr[uVar21]) {
            uVar37 = 0;
          }
          else {
            uVar39 = 1;
            uVar38 = uVar23;
            do {
              uVar37 = uVar39;
              uVar38 = uVar38 + 0x10;
              if (uVar27 <= uVar37) goto LAB_0011cad2;
              uVar39 = (ulong)((int)uVar37 + 1);
            } while (local_f0->arr[uVar38] + iVar31 != (int)local_130->arr[uVar21]);
          }
          bVar43 = true;
          local_124 = local_148;
          uVar41 = (ulong)local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar37];
        }
LAB_0011cad2:
        if (!bVar43) {
          if (uVar23 == 0) {
            if ((int)(this->super_AlignmentEngine).g_ + (int)local_138[0xf] ==
                (int)local_130->arr[0]) goto LAB_0011cb17;
          }
          else if ((int)(this->super_AlignmentEngine).g_ + (int)local_130->arr[uVar21 - 1] ==
                   (int)local_130->arr[uVar21]) {
LAB_0011cb17:
            local_124 = local_148 - 1;
            uVar41 = uVar19 & 0xffffffff;
          }
        }
        uVar23 = local_124;
        local_144 = 0xffffffff;
        if (iVar28 != (int)uVar41) {
          local_144 = (graph->rank_to_node_).
                      super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[local_e0]->id;
        }
        local_d4 = local_148;
        if (local_148 == local_124) {
          local_d4 = 0xffffffff;
        }
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        emplace_back<unsigned_int,int>(local_120,&local_144,(int *)&local_d4);
        bVar43 = true;
        local_149 = true;
        if (iVar28 == (int)uVar41) {
          local_149 = (~uVar23 & 0xf) == 0 && local_148 != uVar23;
        }
        local_148 = uVar23;
        local_114 = uVar23 >> 4;
        local_e8 = uVar41 & 0xffffffff;
        uVar19 = uVar41 & 0xffffffff;
        piVar42 = (int32_t *)(ulong)(uVar23 & 0xf);
      }
    } while (bVar43);
    if ((this->super_AlignmentEngine).type_ == kNW) {
      if (((int)uVar41 == 0) && (local_148 != 0xffffffff)) {
        do {
          local_144 = 0xffffffff;
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int&>
                    (local_120,(int *)&local_144,(int *)&local_148);
          bVar43 = local_148 != 0;
          local_148 = local_148 - 1;
        } while (bVar43);
      }
      if (((int)uVar41 != 0) && (local_148 == 0xffffffff)) {
        do {
          iVar28 = (int)uVar41;
          local_144 = 0xffffffff;
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          emplace_back<unsigned_int&,int>
                    (local_120,
                     &(graph->rank_to_node_).
                      super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[(long)iVar28 + -1]->id,
                     (int *)&local_144);
          pNVar9 = (graph->rank_to_node_).
                   super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[(long)iVar28 + -1];
          ppEVar36 = (pNVar9->inedges).
                     super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          ppEVar12 = *(pointer *)
                      ((long)&(pNVar9->inedges).
                              super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                              ._M_impl + 8);
          if (ppEVar36 == ppEVar12) {
            uVar41 = 0;
          }
          else {
            pIVar8 = (this->pimpl_)._M_t.
                     super___uniq_ptr_impl<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                     .
                     super__Head_base<0UL,_spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation_*,_false>
                     ._M_head_impl;
            lVar20 = *(long *)&(pIVar8->first_column).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl;
            uVar19 = uVar41 & 0xffffffff;
            do {
              ppEVar25 = ppEVar36 + 1;
              uVar41 = (ulong)(*(int *)(*(long *)&(pIVar8->node_id_to_rank).
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       + (ulong)(*ppEVar36)->tail->id * 4) + 1);
              if (*(int *)(lVar20 + (long)iVar28 * 4) ==
                  *(int *)(lVar20 + uVar41 * 4) + (int)(this->super_AlignmentEngine).g_) break;
              uVar41 = uVar19;
              ppEVar36 = ppEVar25;
            } while (ppEVar25 != ppEVar12);
          }
        } while (((int)uVar41 != 0) && (local_148 == 0xffffffff));
      }
    }
    ppVar22 = *(pointer *)local_120;
    ppVar26 = *(pointer *)(local_120 + 8) + -1;
    if (ppVar22 < ppVar26 && ppVar22 != *(pointer *)(local_120 + 8)) {
      do {
        iVar28 = ppVar22->first;
        ppVar22->first = ppVar26->first;
        ppVar26->first = iVar28;
        iVar28 = ppVar22->second;
        ppVar22->second = ppVar26->second;
        ppVar26->second = iVar28;
        ppVar22 = ppVar22 + 1;
        ppVar26 = ppVar26 + -1;
      } while (ppVar22 < ppVar26);
    }
    if (local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (uint *)0x0) {
      operator_delete(local_110.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_110.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_110.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    __return_storage_ptr__ = (Alignment *)local_120;
    if ((pointer)local_c0[0] != (pointer)0x0) {
      operator_delete((void *)local_c0[0],local_c0[2] - local_c0[0],0x20);
      __return_storage_ptr__ = (Alignment *)local_120;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Alignment SimdAlignmentEngine<A>::Linear(
    std::uint32_t sequence_len,
    const Graph& graph,
    std::int32_t* score) noexcept {
#if defined(__AVX2__) || defined(__SSE4_1__) || defined(SPOA_USE_SIMDE)
  std::uint64_t normal_matrix_width = sequence_len;
  std::uint64_t matrix_width =
      std::ceil(static_cast<double>(sequence_len) / T::kNumVar);
  const auto& rank_to_node = graph.rank_to_node();

  typename T::type kNegativeInfinity =
      std::numeric_limits<typename T::type>::min() + 1024;

  __attribute__((aligned(kRegisterSize / 8))) typename T::type unpacked[T::kNumVar] = {0};  // NOLINT

  for (std::uint32_t i = 0, j = 0; i < T::kNumVar && j < T::kLogNumVar; ++i) {
    unpacked[i] = kNegativeInfinity;
    if ((i & (i + 1)) == 0) {
      pimpl_->masks[j++] = _mmxxx_load_si(
        reinterpret_cast<const __mxxxi*>(unpacked));
    }
  }
  pimpl_->masks[T::kLogNumVar] = _mmxxx_slli_si(
      T::_mmxxx_set1_epi(kNegativeInfinity),
      T::kLSS);

  pimpl_->penalties[0] = T::_mmxxx_set1_epi(g_);
  for (std::uint32_t i = 1; i < T::kLogNumVar; ++i) {
    pimpl_->penalties[i] = T::_mmxxx_add_epi(
        pimpl_->penalties[i - 1],
        pimpl_->penalties[i - 1]);
  }

  typename T::type max_score = type_ == AlignmentType::kSW ? 0 : kNegativeInfinity;  // NOLINT
  std::int32_t max_i = -1;
  std::int32_t max_j = -1;
  std::uint32_t last_column_id = (normal_matrix_width - 1) % T::kNumVar;
  __mxxxi zeroes = T::_mmxxx_set1_epi(0);
  __mxxxi g = T::_mmxxx_set1_epi(g_);

  // alignment
  for (const auto& it : rank_to_node) {
    __mxxxi* char_profile = &(pimpl_->sequence_profile[it->code * matrix_width]);  // NOLINT

    std::uint32_t i = pimpl_->node_id_to_rank[it->id] + 1;
    std::uint32_t pred_i = it->inedges.empty() ?
        0 : pimpl_->node_id_to_rank[it->inedges[0]->tail->id] + 1;

    __mxxxi* H_row = &(pimpl_->H[i * matrix_width]);
    __mxxxi* H_pred_row = &(pimpl_->H[pred_i * matrix_width]);

    __mxxxi x = _mmxxx_srli_si(
        T::_mmxxx_set1_epi(pimpl_->first_column[pred_i]),
        T::kRSS);

    for (std::uint64_t j = 0; j < matrix_width; ++j) {
      // get diagonal
      __mxxxi t1 = _mmxxx_srli_si(H_pred_row[j], T::kRSS);
      H_row[j] = _mmxxx_or_si(
          _mmxxx_slli_si(H_pred_row[j], T::kLSS),
          x);
      x = t1;

      // update M
      H_row[j] = T::_mmxxx_max_epi(
          T::_mmxxx_add_epi(H_row[j], char_profile[j]),
          T::_mmxxx_add_epi(H_pred_row[j], g));
    }
    // check other predecessors
    for (std::uint32_t p = 1; p < it->inedges.size(); ++p) {
      pred_i = pimpl_->node_id_to_rank[it->inedges[p]->tail->id] + 1;

      H_pred_row = &(pimpl_->H[pred_i * matrix_width]);

      x = _mmxxx_srli_si(
          T::_mmxxx_set1_epi(pimpl_->first_column[pred_i]),
          T::kRSS);

      for (std::uint64_t j = 0; j < matrix_width; ++j) {
        // get diagonal
        __mxxxi t1 = _mmxxx_srli_si(H_pred_row[j], T::kRSS);
        __mxxxi m = _mmxxx_or_si(
            _mmxxx_slli_si(H_pred_row[j], T::kLSS),
            x);
        x = t1;

        // updage M
        H_row[j] = T::_mmxxx_max_epi(
            H_row[j],
            T::_mmxxx_max_epi(
                T::_mmxxx_add_epi(m, char_profile[j]),
                T::_mmxxx_add_epi(H_pred_row[j], g)));
      }
    }

    __mxxxi score = T::_mmxxx_set1_epi(kNegativeInfinity);
    x = _mmxxx_srli_si(
        T::_mmxxx_add_epi(
            T::_mmxxx_set1_epi(pimpl_->first_column[i]),
            g),
        T::kRSS);

    for (std::uint64_t j = 0; j < matrix_width; ++j) {
      // add last element of previous vector into this one
      H_row[j] = T::_mmxxx_max_epi(
          H_row[j],
          _mmxxx_or_si(x, pimpl_->masks[T::kLogNumVar]));

      T::_mmxxx_prefix_max(H_row[j], pimpl_->masks, pimpl_->penalties);

      x = _mmxxx_srli_si(
          T::_mmxxx_add_epi(H_row[j], g),
          T::kRSS);

      if (type_ == AlignmentType::kSW) {
        H_row[j] = T::_mmxxx_max_epi(H_row[j], zeroes);
      }
      score = T::_mmxxx_max_epi(score, H_row[j]);
    }

    if (type_ == AlignmentType::kSW) {
      std::int32_t max_row_score = _mmxxx_max_value<A, T>(score);
      if (max_score < max_row_score) {
        max_score = max_row_score;
        max_i = i;
      }
    } else if (type_ == AlignmentType::kOV) {
      if (it->outedges.empty()) {
        std::int32_t max_row_score = _mmxxx_max_value<A, T>(score);
        if (max_score < max_row_score) {
          max_score = max_row_score;
          max_i = i;
        }
      }
    } else if (type_ == AlignmentType::kNW) {
      if (it->outedges.empty()) {
        std::int32_t max_row_score = _mmxxx_value_at<A, T>(
            H_row[matrix_width - 1],
            last_column_id);
        if (max_score < max_row_score) {
          max_score = max_row_score;
          max_i = i;
        }
      }
    }
  }

  if (max_i == -1 && max_j == -1) {
    return Alignment();
  }
  if (score) {
    *score = max_score;
  }

  if (type_ == AlignmentType::kSW) {
    max_j = _mmxxx_index_of<A, T>(
        &(pimpl_->H[max_i * matrix_width]),
        matrix_width,
        max_score);
  } else if (type_ == AlignmentType::kOV) {
    if (rank_to_node[max_i - 1]->outedges.empty()) {
      max_j = _mmxxx_index_of<A, T>(
          &(pimpl_->H[max_i * matrix_width]),
          matrix_width,
          max_score);
    } else {
      max_j = normal_matrix_width - 1;
    }
  } else if (type_ == AlignmentType::kNW) {
    max_j = normal_matrix_width - 1;
  }

  // backtrack
  std::uint32_t max_num_predecessors = 1;
  for (std::uint32_t i = 0; i < static_cast<std::uint32_t>(max_i); ++i) {
    max_num_predecessors = std::max(
        max_num_predecessors,
        static_cast<std::uint32_t>(rank_to_node[i]->inedges.size()));
  }

  std::vector<typename T::Storage> backtrack_storage(3 * T::kNumVar + 2 * T::kNumVar * max_num_predecessors);
  typename T::type* H = reinterpret_cast<typename T::type*>(backtrack_storage.data());
  typename T::type* H_pred = H + T::kNumVar;
  typename T::type* H_diag_pred = H_pred + T::kNumVar * max_num_predecessors;
  typename T::type* H_left_pred = H_diag_pred + T::kNumVar * max_num_predecessors;  // NOLINT
  typename T::type* profile = H_left_pred + T::kNumVar;

  std::vector<std::uint32_t> predecessors;

  std::int32_t i = max_i;
  std::int32_t j = max_j;
  std::int32_t prev_i = 0, prev_j = 0;

  std::uint32_t j_div = j / T::kNumVar;
  std::uint32_t j_mod = j % T::kNumVar;

  bool load_next_segment = true;

  Alignment alignment;

  do {
    // check stop condition
    if (j == -1 || i == 0) {
      break;
    }

    const auto& it = rank_to_node[i - 1];
    // load everything
    if (load_next_segment) {
      predecessors.clear();

      // load current cells
      _mmxxx_store_si(
          reinterpret_cast<__mxxxi*>(H),
          pimpl_->H[i * matrix_width + j_div]);

      // load predecessors cells
      if (it->inedges.empty()) {
        predecessors.emplace_back(0);
        _mmxxx_store_si(reinterpret_cast<__mxxxi*>(H_pred), pimpl_->H[j_div]);
      } else {
        std::uint32_t store_pos = 0;
        for (const auto& jt : it->inedges) {
          predecessors.emplace_back(pimpl_->node_id_to_rank[jt->tail->id] + 1);
          _mmxxx_store_si(
              reinterpret_cast<__mxxxi*>(&H_pred[store_pos * T::kNumVar]),
              pimpl_->H[predecessors.back() * matrix_width + j_div]);
          ++store_pos;
        }
      }

      // load query profile cells
      _mmxxx_store_si(
          reinterpret_cast<__mxxxi*>(profile),
          pimpl_->sequence_profile[it->code * matrix_width + j_div]);
    }

    // check stop condition
    if (type_ == AlignmentType::kSW && H[j_mod] == 0) {
      break;
    }

    if (j_mod == 0) {
      // border case
      if (j_div > 0) {
        _mmxxx_store_si(
            reinterpret_cast<__mxxxi*>(H_left_pred),
            pimpl_->H[i * matrix_width + j_div - 1]);

        for (std::uint32_t p = 0; p < predecessors.size(); ++p) {
          _mmxxx_store_si(
              reinterpret_cast<__mxxxi*>(&H_diag_pred[p * T::kNumVar]),
              pimpl_->H[predecessors[p] * matrix_width + (j_div - 1)]);
        }
      } else {
        H_left_pred[T::kNumVar - 1] = pimpl_->first_column[i];

        for (std::uint32_t p = 0; p < predecessors.size(); ++p) {
          H_diag_pred[(p + 1) * T::kNumVar - 1] =
              pimpl_->first_column[predecessors[p]];
        }
      }
    }

    // find best predecessor cell
    bool predecessor_found = false;

    if (i != 0) {
      for (std::uint32_t p = 0; p < predecessors.size(); ++p) {
        if ((j_mod == 0 && H[j_mod] == H_diag_pred[(p + 1) * T::kNumVar - 1] + profile[j_mod]) ||  // NOLINT
            (j_mod != 0 && H[j_mod] == H_pred[p * T::kNumVar + j_mod - 1] + profile[j_mod])) {  // NOLINT
          prev_i = predecessors[p];
          prev_j = j - 1;
          predecessor_found = true;
          break;
        }
      }
    }

    if (!predecessor_found && i != 0) {
      for (std::uint32_t p = 0; p < predecessors.size(); ++p) {
        if (H[j_mod] == H_pred[p * T::kNumVar + j_mod] + g_) {
          prev_i = predecessors[p];
          prev_j = j;
          predecessor_found = true;
          break;
        }
      }
    }

    if (!predecessor_found) {
      if ((j_mod == 0 && H[j_mod] == H_left_pred[T::kNumVar - 1] + g_) ||
          (j_mod != 0 && H[j_mod] == H[j_mod - 1] + g_)) {
        prev_i = i;
        prev_j = j - 1;
        predecessor_found = true;
      }
    }

    alignment.emplace_back(
        i == prev_i ? -1 : rank_to_node[i - 1]->id,
        j == prev_j ? -1 : j);

    // update for next round
    load_next_segment =
        (i == prev_i ? false : true) ||
        (j != prev_j && prev_j % T::kNumVar == T::kNumVar - 1 ? true : false);

    i = prev_i;
    j = prev_j;
    j_div = j / T::kNumVar;
    j_mod = j % T::kNumVar;
  } while (true);

  // update alignment for NW (backtrack stops on first row or column)
  if (type_ == AlignmentType::kNW) {
    while (i == 0 && j != -1) {
      alignment.emplace_back(-1, j);
      --j;
    }
    while (i != 0 && j == -1) {
      alignment.emplace_back(rank_to_node[i - 1]->id, -1);

      const auto& it = rank_to_node[i - 1];
      if (it->inedges.empty()) {
          i = 0;
      } else {
        for (const auto& jt : it->inedges) {
          std::uint32_t pred_i = pimpl_->node_id_to_rank[jt->tail->id] + 1;
          if (pimpl_->first_column[i] == pimpl_->first_column[pred_i] + g_) {
            i = pred_i;
            break;
          }
        }
      }
    }
  }

  std::reverse(alignment.begin(), alignment.end());
  return alignment;
#else
  (void) sequence_len;
  (void) graph;
  (void) score;
  return Alignment();
#endif
}